

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

int SUNQRfact(int n,sunrealtype **h,sunrealtype *q,int job)

{
  double dVar1;
  sunrealtype *psVar2;
  ulong uVar3;
  sunrealtype *psVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  sunrealtype sVar11;
  double dVar12;
  double dVar13;
  
  if (job == 0) {
    if (0 < n) {
      uVar9 = 0;
      uVar5 = 0xffffffff;
      uVar3 = 0;
      do {
        if (1 < uVar9) {
          sVar11 = (*h)[uVar9];
          uVar8 = 0;
          psVar4 = *h;
          pdVar7 = q + 1;
          do {
            psVar2 = h[uVar8 + 1];
            uVar8 = uVar8 + 1;
            dVar10 = psVar2[uVar9];
            dVar1 = pdVar7[-1];
            dVar13 = *pdVar7;
            psVar4[uVar9] = dVar1 * sVar11 - dVar10 * dVar13;
            sVar11 = dVar13 * sVar11 + dVar10 * dVar1;
            psVar2[uVar9] = sVar11;
            pdVar7 = pdVar7 + 2;
            psVar4 = psVar2;
          } while (uVar5 != uVar8);
        }
        psVar4 = h[uVar9];
        dVar10 = psVar4[uVar9];
        dVar1 = h[uVar9 + 1][uVar9];
        dVar13 = 0.0;
        dVar12 = 1.0;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          if (ABS(dVar10) <= ABS(dVar1)) {
            dVar12 = dVar10 / dVar1;
            dVar13 = dVar12 * dVar12 + 1.0;
            uVar8 = -(ulong)(0.0 < dVar13);
            dVar13 = (double)(~uVar8 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar13)) & uVar8);
            dVar12 = -dVar13 * dVar12;
          }
          else {
            dVar13 = dVar1 / dVar10;
            dVar12 = dVar13 * dVar13 + 1.0;
            uVar8 = -(ulong)(0.0 < dVar12);
            dVar12 = (double)(~uVar8 & 0x7ff0000000000000 | (ulong)(1.0 / SQRT(dVar12)) & uVar8);
            dVar13 = -dVar12 * dVar13;
          }
        }
        q[uVar9 * 2] = dVar12;
        q[uVar9 * 2 + 1] = dVar13;
        dVar10 = dVar10 * dVar12 - dVar1 * dVar13;
        psVar4[uVar9] = dVar10;
        uVar9 = uVar9 + 1;
        uVar8 = uVar9 & 0xffffffff;
        if (dVar10 != 0.0) {
          uVar8 = uVar3;
        }
        if (!NAN(dVar10)) {
          uVar3 = uVar8;
        }
        uVar5 = uVar5 + 1;
      } while (uVar9 != (uint)n);
      return (int)uVar3;
    }
  }
  else {
    uVar5 = n - 1;
    if (n < 2) {
      uVar3 = (ulong)(int)uVar5;
    }
    else {
      uVar3 = (ulong)uVar5;
      sVar11 = (*h)[uVar3];
      lVar6 = 0;
      psVar4 = *h;
      do {
        psVar2 = *(sunrealtype **)((long)h + lVar6 + 8);
        dVar10 = psVar2[uVar3];
        dVar1 = *(double *)((long)q + lVar6 * 2);
        dVar13 = *(double *)((long)q + lVar6 * 2 + 8);
        psVar4[uVar3] = dVar1 * sVar11 - dVar10 * dVar13;
        sVar11 = dVar13 * sVar11 + dVar10 * dVar1;
        psVar2[uVar3] = sVar11;
        lVar6 = lVar6 + 8;
        psVar4 = psVar2;
      } while (uVar3 * 8 - lVar6 != 0);
    }
    psVar4 = h[uVar3];
    dVar10 = psVar4[uVar3];
    dVar1 = h[n][uVar3];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (ABS(dVar10) <= ABS(dVar1)) {
        dVar12 = dVar10 / dVar1;
        dVar13 = dVar12 * dVar12 + 1.0;
        uVar9 = -(ulong)(0.0 < dVar13);
        dVar13 = (double)(~uVar9 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar13)) & uVar9);
        dVar12 = -dVar13 * dVar12;
      }
      else {
        dVar13 = dVar1 / dVar10;
        dVar12 = dVar13 * dVar13 + 1.0;
        uVar9 = -(ulong)(0.0 < dVar12);
        dVar12 = (double)(~uVar9 & 0x7ff0000000000000 | (ulong)(1.0 / SQRT(dVar12)) & uVar9);
        dVar13 = -dVar12 * dVar13;
      }
    }
    else {
      dVar12 = 1.0;
      dVar13 = 0.0;
    }
    q[(int)(uVar5 * 2)] = dVar12;
    q[(int)(uVar5 * 2 + 1)] = dVar13;
    dVar10 = dVar10 * dVar12 - dVar1 * dVar13;
    psVar4[uVar3] = dVar10;
    if ((dVar10 == 0.0) && (!NAN(dVar10))) {
      return n;
    }
  }
  return 0;
}

Assistant:

int SUNQRfact(int n, sunrealtype** h, sunrealtype* q, int job)
{
  sunrealtype c, s, temp1, temp2, temp3;
  int i, j, k, q_ptr, n_minus_1, code = 0;

  switch (job)
  {
  case 0:

    /* Compute a new factorization of H */

    code = 0;
    for (k = 0; k < n; k++)
    {
      /* Multiply column k by the previous k-1 Givens rotations */

      for (j = 0; j < k - 1; j++)
      {
        i           = 2 * j;
        temp1       = h[j][k];
        temp2       = h[j + 1][k];
        c           = q[i];
        s           = q[i + 1];
        h[j][k]     = c * temp1 - s * temp2;
        h[j + 1][k] = s * temp1 + c * temp2;
      }

      /* Compute the Givens rotation components c and s */

      q_ptr = 2 * k;
      temp1 = h[k][k];
      temp2 = h[k + 1][k];
      if (temp2 == ZERO)
      {
        c = ONE;
        s = ZERO;
      }
      else if (SUNRabs(temp2) >= SUNRabs(temp1))
      {
        temp3 = temp1 / temp2;
        s     = -ONE / SUNRsqrt(ONE + SUNSQR(temp3));
        c     = -s * temp3;
      }
      else
      {
        temp3 = temp2 / temp1;
        c     = ONE / SUNRsqrt(ONE + SUNSQR(temp3));
        s     = -c * temp3;
      }
      q[q_ptr]     = c;
      q[q_ptr + 1] = s;
      if ((h[k][k] = c * temp1 - s * temp2) == ZERO) { code = k + 1; }
    }
    break;

  default:

    /* Update the factored H to which a new column has been added */

    n_minus_1 = n - 1;
    code      = 0;

    /* Multiply the new column by the previous n-1 Givens rotations */

    for (k = 0; k < n_minus_1; k++)
    {
      i                   = 2 * k;
      temp1               = h[k][n_minus_1];
      temp2               = h[k + 1][n_minus_1];
      c                   = q[i];
      s                   = q[i + 1];
      h[k][n_minus_1]     = c * temp1 - s * temp2;
      h[k + 1][n_minus_1] = s * temp1 + c * temp2;
    }

    /* Compute new Givens rotation and multiply it times the last two
       entries in the new column of H.  Note that the second entry of
       this product will be 0, so it is not necessary to compute it. */

    temp1 = h[n_minus_1][n_minus_1];
    temp2 = h[n][n_minus_1];
    if (temp2 == ZERO)
    {
      c = ONE;
      s = ZERO;
    }
    else if (SUNRabs(temp2) >= SUNRabs(temp1))
    {
      temp3 = temp1 / temp2;
      s     = -ONE / SUNRsqrt(ONE + SUNSQR(temp3));
      c     = -s * temp3;
    }
    else
    {
      temp3 = temp2 / temp1;
      c     = ONE / SUNRsqrt(ONE + SUNSQR(temp3));
      s     = -c * temp3;
    }
    q_ptr        = 2 * n_minus_1;
    q[q_ptr]     = c;
    q[q_ptr + 1] = s;
    if ((h[n_minus_1][n_minus_1] = c * temp1 - s * temp2) == ZERO) { code = n; }
  }

  return (code);
}